

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void ur_dftest2(void)

{
  int local_53c;
  int local_538;
  int cvcols;
  int cvrows;
  int lags;
  int ltstat;
  int laux;
  double teststat [3];
  double local_508;
  double cprobs [3];
  double local_4e8;
  double cval [3];
  double pval;
  double stat;
  int lshort;
  char *selectlags;
  char *type;
  int N;
  double x [144];
  
  memcpy(&stack0xfffffffffffffb68,&DAT_00180920,0x480);
  memset(&local_4e8,0,0x18);
  memset(&local_508,0,0x18);
  memset(&ltstat,0,0x18);
  cvcols = 0;
  ur_df2((double *)&stack0xfffffffffffffb68,0x90,"trend",&cvcols,"aic",&local_4e8,&local_538,
         &local_53c,&local_508,(double *)&ltstat,&cvrows);
  mdisplay(&local_4e8,local_538,local_53c);
  mdisplay((double *)&ltstat,1,cvrows);
  return;
}

Assistant:

void ur_dftest2() {
	double x[144] = {112, 118, 132, 129, 121, 135, 148, 148, 136, 119, 104, 118,
        115, 126, 141, 135, 125, 149, 170, 170, 158, 133, 114, 140,
        145, 150, 178, 163, 172, 178, 199, 199, 184, 162, 146, 166,
        171, 180, 193, 181, 183, 218, 230, 242, 209, 191, 172, 194,
        196, 196, 236, 235, 229, 243, 264, 272, 237, 211, 180, 201,
        204, 188, 235, 227, 234, 264, 302, 293, 259, 229, 203, 229,
        242, 233, 267, 269, 270, 315, 364, 347, 312, 274, 237, 278,
        284, 277, 317, 313, 318, 374, 413, 405, 355, 306, 271, 306,
        315, 301, 356, 348, 355, 422, 465, 467, 404, 347, 305, 336,
        340, 318, 362, 348, 363, 435, 491, 505, 404, 359, 310, 337,
        360, 342, 406, 396, 420, 472, 548, 559, 463, 407, 362, 405,
        417, 391, 419, 461, 472, 535, 622, 606, 508, 461, 390, 432
	};

	int N = 144;
	const char *type = "trend";
	const char *selectlags = "aic";
	int lshort = 1;
	double stat,pval;
	double cval[3] = {0,0,0};
	double cprobs[3] = {0,0,0};
	double teststat[3] = {0,0,0};
	int laux;
	int ltstat;
	int lags = 0;
	int cvrows, cvcols;

	//ur_pp2(x,N,type,model,lshort,NULL,cval,cprobs,auxstat,&laux,&teststat);
	ur_df2(x,N,type,&lags,selectlags,cval,&cvrows,&cvcols,cprobs,teststat,&ltstat);

	mdisplay(cval,cvrows,cvcols);
	//mdisplay(auxstat,1,laux);
	mdisplay(teststat,1,ltstat);
}